

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFCommon.cpp
# Opt level: O0

void glTFCommon::Util::EncodeBase64(uint8_t *in,size_t inLength,string *out)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  undefined1 *puVar4;
  ulong uStack_38;
  uint8_t b;
  size_t i;
  size_t j;
  size_t outLength;
  string *out_local;
  size_t inLength_local;
  uint8_t *in_local;
  
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)out);
  for (uStack_38 = 0; uStack_38 < inLength; uStack_38 = uStack_38 + 3) {
    cVar1 = EncodeCharBase64((uint8_t)((int)(in[uStack_38] & 0xfc) >> 2));
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)out);
    *pcVar3 = cVar1;
    bVar2 = (in[uStack_38] & 3) << 4;
    if (uStack_38 + 1 < inLength) {
      cVar1 = EncodeCharBase64(bVar2 | (byte)((int)(in[uStack_38 + 1] & 0xf0) >> 4));
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)out);
      *pcVar3 = cVar1;
      bVar2 = (in[uStack_38 + 1] & 0xf) << 2;
      if (uStack_38 + 2 < inLength) {
        cVar1 = EncodeCharBase64(bVar2 | (byte)((int)(in[uStack_38 + 2] & 0xc0) >> 6));
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)out);
        *pcVar3 = cVar1;
        cVar1 = EncodeCharBase64(in[uStack_38 + 2] & 0x3f);
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)out);
        *pcVar3 = cVar1;
      }
      else {
        cVar1 = EncodeCharBase64(bVar2);
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)out);
        *pcVar3 = cVar1;
        puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)out);
        *puVar4 = 0x3d;
      }
    }
    else {
      cVar1 = EncodeCharBase64(bVar2);
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)out);
      *pcVar3 = cVar1;
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)out);
      *puVar4 = 0x3d;
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)out);
      *puVar4 = 0x3d;
    }
  }
  return;
}

Assistant:

void EncodeBase64(const uint8_t* in, size_t inLength, std::string& out) {
    size_t outLength = ((inLength + 2) / 3) * 4;

    size_t j = out.size();
    out.resize(j + outLength);

    for (size_t i = 0; i < inLength; i += 3) {
        uint8_t b = (in[i] & 0xFC) >> 2;
        out[j++] = EncodeCharBase64(b);

        b = (in[i] & 0x03) << 4;
        if (i + 1 < inLength) {
            b |= (in[i + 1] & 0xF0) >> 4;
            out[j++] = EncodeCharBase64(b);

            b = (in[i + 1] & 0x0F) << 2;
            if (i + 2 < inLength) {
                b |= (in[i + 2] & 0xC0) >> 6;
                out[j++] = EncodeCharBase64(b);

                b = in[i + 2] & 0x3F;
                out[j++] = EncodeCharBase64(b);
            }
            else {
                out[j++] = EncodeCharBase64(b);
                out[j++] = '=';
            }
        }
        else {
            out[j++] = EncodeCharBase64(b);
            out[j++] = '=';
            out[j++] = '=';
        }
    }
}